

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t1decode.c
# Opt level: O2

void t1_decoder_done(T1_Decoder_conflict decoder)

{
  FT_Memory memory;
  FT_GlyphSlot pFVar1;
  FT_Outline *pFVar2;
  FT_Generic_Finalizer p_Var3;
  FT_Vector *pFVar4;
  short *psVar5;
  undefined4 uVar6;
  short sVar7;
  short sVar8;
  
  memory = (decoder->builder).memory;
  pFVar1 = (decoder->builder).glyph;
  if (pFVar1 != (FT_GlyphSlot)0x0) {
    pFVar2 = (decoder->builder).base;
    uVar6 = *(undefined4 *)&pFVar2->field_0x24;
    (pFVar1->outline).flags = pFVar2->flags;
    *(undefined4 *)&(pFVar1->outline).field_0x24 = uVar6;
    sVar7 = pFVar2->n_contours;
    sVar8 = pFVar2->n_points;
    uVar6 = *(undefined4 *)&pFVar2->field_0x4;
    pFVar4 = pFVar2->points;
    psVar5 = pFVar2->contours;
    (pFVar1->outline).tags = pFVar2->tags;
    (pFVar1->outline).contours = psVar5;
    (pFVar1->outline).n_contours = sVar7;
    (pFVar1->outline).n_points = sVar8;
    *(undefined4 *)&(pFVar1->outline).field_0x4 = uVar6;
    (pFVar1->outline).points = pFVar4;
  }
  p_Var3 = (decoder->cf2_instance).finalizer;
  if (p_Var3 != (FT_Generic_Finalizer)0x0) {
    (*p_Var3)((decoder->cf2_instance).data);
    ft_mem_free(memory,(decoder->cf2_instance).data);
    (decoder->cf2_instance).data = (void *)0x0;
  }
  return;
}

Assistant:

FT_LOCAL_DEF( void )
  t1_decoder_done( T1_Decoder  decoder )
  {
    FT_Memory  memory = decoder->builder.memory;


    t1_builder_done( &decoder->builder );

    if ( decoder->cf2_instance.finalizer )
    {
      decoder->cf2_instance.finalizer( decoder->cf2_instance.data );
      FT_FREE( decoder->cf2_instance.data );
    }
  }